

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

void Js::DynamicProfileInfo::DumpProfiledValue(char16 *name,CallSiteInfo *callSiteInfo,uint count)

{
  Type TVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  char16_t *pcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char local_148 [8];
  char returnTypeStr [256];
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name);
    returnTypeStr._248_8_ = __tls_get_addr(&PTR_01548f08);
    uVar9 = 0;
    do {
      uVar8 = 0;
      pcVar6 = L" ";
      if (uVar9 != 0) {
        uVar5 = (int)uVar9 * -0x33333333;
        pcVar6 = L" ";
        if ((uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f) < 0x1999999a) {
          pcVar6 = L"\n                          ";
        }
        uVar8 = uVar9 & 0xffffffff;
      }
      Output::Print(pcVar6);
      Output::Print(L"%2d:",uVar8);
      if (*(short *)&callSiteInfo[uVar9].field_0x2 < 0) {
        Output::Print(L" poly");
        lVar7 = -4;
        do {
          if (*(int *)((long)callSiteInfo[uVar9].u + 0x10 + lVar7 * 4) != -4) {
            Output::Print(L" %4d:%4d",
                          (ulong)*(uint *)((long)callSiteInfo[uVar9].u + 0x20 + lVar7 * 4));
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0);
      }
      else {
        uVar5 = callSiteInfo[uVar9].u.functionData.sourceId;
        if (uVar5 == 0xfffffffc) {
          TVar1 = callSiteInfo[uVar9].u.functionData.functionId;
          if (TVar1 == 0xfffffffd) {
            pcVar6 = L"  !fn";
          }
          else if (TVar1 == 0xfffffffe) {
            pcVar6 = L"    x";
          }
          else {
            if (TVar1 != 0xffffffff) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              uVar3 = returnTypeStr._248_8_;
              *(undefined4 *)returnTypeStr._248_8_ = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                          ,0x65b,"(false)","false");
              if (!bVar4) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              *(undefined4 *)uVar3 = 0;
              goto LAB_00963bb7;
            }
            pcVar6 = L"  mix";
          }
LAB_00963b37:
          Output::Print(pcVar6);
        }
        else if (uVar5 == 0xfffffffe) {
          Output::Print(L" b%03d",(ulong)callSiteInfo[uVar9].u.functionData.functionId);
        }
        else {
          if (uVar5 == 0xffffffff) {
            pcVar6 = L" ????";
            goto LAB_00963b37;
          }
          Output::Print(L" %4d:%4d",(ulong)uVar5,
                        (ulong)callSiteInfo[uVar9].u.functionData.functionId);
        }
      }
LAB_00963bb7:
      uVar9 = uVar9 + 1;
    } while (uVar9 != count);
    Output::Print(L"\n");
    Output::Print(L"    %-16s(%2d):",L"Callsite RetType",(ulong)count);
    uVar9 = 0;
    do {
      uVar8 = 0;
      pcVar6 = L" ";
      if (uVar9 != 0) {
        pcVar6 = L"\n                          ";
        if ((int)((uVar9 & 0xffffffff) / 10) * -10 + (int)uVar9 != 0) {
          pcVar6 = L" ";
        }
        uVar8 = uVar9 & 0xffffffff;
      }
      Output::Print(pcVar6);
      Output::Print(L"%2d:",uVar8);
      ValueType::ToString(&callSiteInfo->returnType,(char (*) [256])local_148);
      Output::Print(L"  %S",(char (*) [256])local_148);
      uVar9 = uVar9 + 1;
      callSiteInfo = callSiteInfo + 1;
    } while (count != uVar9);
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, CallSiteInfo * callSiteInfo, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                if (!callSiteInfo[i].isPolymorphic)
                {
                    switch (callSiteInfo[i].u.functionData.sourceId)
                    {
                    case NoSourceId:
                        Output::Print(_u(" ????"));
                        break;

                    case BuiltInSourceId:
                        Output::Print(_u(" b%03d"), callSiteInfo[i].u.functionData.functionId);
                        break;

                    case InvalidSourceId:
                        if (callSiteInfo[i].u.functionData.functionId == CallSiteMixed)
                        {
                            Output::Print(_u("  mix"));
                        }
                        else if (callSiteInfo[i].u.functionData.functionId == CallSiteCrossContext)
                        {
                            Output::Print(_u("    x"));
                        }
                        else if (callSiteInfo[i].u.functionData.functionId == CallSiteNonFunction)
                        {
                            Output::Print(_u("  !fn"));
                        }
                        else
                        {
                            Assert(false);
                        }
                        break;

                    default:
                        Output::Print(_u(" %4d:%4d"), callSiteInfo[i].u.functionData.sourceId, callSiteInfo[i].u.functionData.functionId);
                        break;
                    };
                }
                else
                {
                    Output::Print(_u(" poly"));
                    for (int j = 0; j < DynamicProfileInfo::maxPolymorphicInliningSize; j++)
                    {
                        if (callSiteInfo[i].u.polymorphicCallSiteInfo->functionIds[j] != CallSiteNoInfo)
                        {
                            Output::Print(_u(" %4d:%4d"), callSiteInfo[i].u.polymorphicCallSiteInfo->sourceIds[j], callSiteInfo[i].u.polymorphicCallSiteInfo->functionIds[j]);
                        }
                    }
                }
            }
            Output::Print(_u("\n"));

            Output::Print(_u("    %-16s(%2d):"), _u("Callsite RetType"), count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                char returnTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                callSiteInfo[i].returnType.ToString(returnTypeStr);
                Output::Print(_u("  %S"), returnTypeStr);
            }
            Output::Print(_u("\n"));
        }
    }